

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::update(Texture *this,Texture *texture,uint x,uint y)

{
  GLenum GVar1;
  GLenum GVar2;
  ostream *poVar3;
  Uint64 UVar4;
  int in_ECX;
  int in_EDX;
  GLint *in_RSI;
  Texture *in_RDI;
  TextureSaver save;
  GLenum destStatus;
  GLenum sourceStatus;
  GLuint destFrameBuffer;
  GLuint sourceFrameBuffer;
  GLint drawFramebuffer;
  GLint readFramebuffer;
  TransientContextLock lock_1;
  TransientContextLock lock;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff40;
  Image *in_stack_ffffffffffffff48;
  Texture *in_stack_ffffffffffffff50;
  GLint local_a8;
  GLint local_9c;
  GLuint local_40;
  GLuint local_3c;
  GLuint local_38;
  GLuint local_34 [7];
  int local_18;
  int local_14;
  GLint *local_10;
  Texture *this_00;
  
  if ((in_RDI->m_texture != 0) && (in_RSI[4] != 0)) {
    local_18 = in_ECX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    this_00 = in_RDI;
    GlResource::TransientContextLock::TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
              );
    priv::ensureExtensionsInit();
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
              );
    if ((SF_GLAD_GL_EXT_framebuffer_object == 0) || (SF_GLAD_GL_EXT_framebuffer_blit == 0)) {
      copyToImage(this_00);
      update(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20),(uint)in_stack_ffffffffffffff40);
      Image::~Image((Image *)0x2001cf);
    }
    else {
      GlResource::TransientContextLock::TransientContextLock
                ((TransientContextLock *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_34[0] = 0;
      local_38 = 0;
      (*sf_glad_glGetIntegerv)(0x8caa,(GLint *)local_34);
      (*sf_glad_glGetIntegerv)(0x8ca6,(GLint *)&local_38);
      local_3c = 0;
      local_40 = 0;
      (*sf_glad_glGenFramebuffersEXT)(1,&local_3c);
      (*sf_glad_glGenFramebuffersEXT)(1,&local_40);
      if ((local_3c == 0) || (local_40 == 0)) {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "Cannot copy texture, failed to create a frame buffer object");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        (*sf_glad_glBindFramebufferEXT)(0x8ca8,local_3c);
        (*sf_glad_glFramebufferTexture2DEXT)(0x8ca8,0x8ce0,0xde1,local_10[4],0);
        (*sf_glad_glBindFramebufferEXT)(0x8ca9,local_40);
        (*sf_glad_glFramebufferTexture2DEXT)(0x8ca9,0x8ce0,0xde1,in_RDI->m_texture,0);
        GVar1 = (*sf_glad_glCheckFramebufferStatusEXT)(0x8ca8);
        GVar2 = (*sf_glad_glCheckFramebufferStatusEXT)(0x8ca9);
        if ((GVar1 == 0x8cd5) && (GVar2 == 0x8cd5)) {
          if ((*(byte *)((long)local_10 + 0x17) & 1) == 0) {
            local_9c = 0;
          }
          else {
            local_9c = local_10[1];
          }
          if ((*(byte *)((long)local_10 + 0x17) & 1) == 0) {
            local_a8 = local_10[1];
          }
          else {
            local_a8 = 0;
          }
          in_stack_ffffffffffffff20 = local_18 + local_10[1];
          (*sf_glad_glBlitFramebufferEXT)
                    (0,local_9c,*local_10,local_a8,local_14,local_18,local_14 + *local_10,
                     in_stack_ffffffffffffff20,0x4000,0x2600);
        }
        else {
          poVar3 = err();
          poVar3 = std::operator<<(poVar3,
                                   "Cannot copy texture, failed to link texture to frame buffer");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        (*sf_glad_glBindFramebufferEXT)(0x8ca8,local_34[0]);
        (*sf_glad_glBindFramebufferEXT)(0x8ca9,local_38);
        (*sf_glad_glDeleteFramebuffersEXT)(1,&local_3c);
        (*sf_glad_glDeleteFramebuffersEXT)(1,&local_40);
        priv::TextureSaver::TextureSaver((TextureSaver *)0x2000b8);
        (*sf_glad_glBindTexture)(0xde1,in_RDI->m_texture);
        (*sf_glad_glTexParameteri)(0xde1,0x2801,in_RDI->m_isSmooth & 1 | 0x2600);
        in_RDI->m_hasMipmap = false;
        in_RDI->m_pixelsFlipped = false;
        UVar4 = anon_unknown.dwarf_10c113::TextureImpl::getUniqueId();
        in_RDI->m_cacheId = UVar4;
        (*sf_glad_glFlush)();
        priv::TextureSaver::~TextureSaver((TextureSaver *)0x20014c);
      }
      GlResource::TransientContextLock::~TransientContextLock
                ((TransientContextLock *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
  }
  return;
}

Assistant:

void Texture::update(const Texture& texture, unsigned int x, unsigned int y)
{
    assert(x + texture.m_size.x <= m_size.x);
    assert(y + texture.m_size.y <= m_size.y);

    if (!m_texture || !texture.m_texture)
        return;

#ifndef SFML_OPENGL_ES

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();
    }

    if (GLEXT_framebuffer_object && GLEXT_framebuffer_blit)
    {
        TransientContextLock lock;

        // Save the current bindings so we can restore them after we are done
        GLint readFramebuffer = 0;
        GLint drawFramebuffer = 0;

        glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
        glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

        // Create the framebuffers
        GLuint sourceFrameBuffer = 0;
        GLuint destFrameBuffer = 0;
        glCheck(GLEXT_glGenFramebuffers(1, &sourceFrameBuffer));
        glCheck(GLEXT_glGenFramebuffers(1, &destFrameBuffer));

        if (!sourceFrameBuffer || !destFrameBuffer)
        {
            err() << "Cannot copy texture, failed to create a frame buffer object" << std::endl;
            return;
        }

        // Link the source texture to the source frame buffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, sourceFrameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_READ_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture.m_texture, 0));

        // Link the destination texture to the destination frame buffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, destFrameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_DRAW_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0));

        // A final check, just to be sure...
        GLenum sourceStatus;
        glCheck(sourceStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_READ_FRAMEBUFFER));

        GLenum destStatus;
        glCheck(destStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_DRAW_FRAMEBUFFER));

        if ((sourceStatus == GLEXT_GL_FRAMEBUFFER_COMPLETE) && (destStatus == GLEXT_GL_FRAMEBUFFER_COMPLETE))
        {
            // Blit the texture contents from the source to the destination texture
            glCheck(GLEXT_glBlitFramebuffer(
                0, texture.m_pixelsFlipped ? static_cast<GLint>(texture.m_size.y) : 0, static_cast<GLint>(texture.m_size.x), texture.m_pixelsFlipped ? 0 : static_cast<GLint>(texture.m_size.y), // Source rectangle, flip y if source is flipped
                static_cast<GLint>(x), static_cast<GLint>(y), static_cast<GLint>(x + texture.m_size.x), static_cast<GLint>(y + texture.m_size.y), // Destination rectangle
                GL_COLOR_BUFFER_BIT, GL_NEAREST
            ));
        }
        else
        {
            err() << "Cannot copy texture, failed to link texture to frame buffer" << std::endl;
        }

        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, static_cast<GLuint>(readFramebuffer)));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, static_cast<GLuint>(drawFramebuffer)));

        // Delete the framebuffers
        glCheck(GLEXT_glDeleteFramebuffers(1, &sourceFrameBuffer));
        glCheck(GLEXT_glDeleteFramebuffers(1, &destFrameBuffer));

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Set the parameters of this texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = false;
        m_cacheId = TextureImpl::getUniqueId();

        // Force an OpenGL flush, so that the texture data will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());

        return;
    }

#endif // SFML_OPENGL_ES

    update(texture.copyToImage(), x, y);
}